

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

int ikcp_send(ikcpcb *kcp,char *buffer,int len)

{
  IQUEUEHEAD *pIVar1;
  IUINT32 IVar2;
  IQUEUEHEAD *pIVar3;
  IQUEUEHEAD *pIVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  _func_void_ptr_size_t *p_Var10;
  
  uVar9 = kcp->mss;
  if (uVar9 == 0) {
    __assert_fail("kcp->mss > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x1da,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  if (-1 < len) {
    if (kcp->stream != 0) {
      if (&kcp->snd_queue != (kcp->snd_queue).next) {
        pIVar4 = (kcp->snd_queue).prev;
        uVar6 = *(uint *)((long)&pIVar4[2].prev + 4);
        iVar8 = uVar9 - uVar6;
        if (uVar6 <= uVar9 && iVar8 != 0) {
          if (len <= iVar8) {
            iVar8 = len;
          }
          sVar7 = (long)(int)(uVar6 + iVar8) + 0x48;
          if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
            pIVar3 = (IQUEUEHEAD *)malloc(sVar7);
          }
          else {
            pIVar3 = (IQUEUEHEAD *)(*ikcp_malloc_hook)(sVar7);
          }
          if (pIVar3 == (IQUEUEHEAD *)0x0) {
            __assert_fail("seg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                          ,0x1e5,"int ikcp_send(ikcpcb *, const char *, int)");
          }
          pIVar1 = (kcp->snd_queue).prev;
          pIVar3->prev = pIVar1;
          pIVar3->next = &kcp->snd_queue;
          pIVar1->next = pIVar3;
          (kcp->snd_queue).prev = pIVar3;
          memcpy(pIVar3 + 4,pIVar4 + 4,(ulong)*(uint *)((long)&pIVar4[2].prev + 4));
          if (buffer == (char *)0x0) {
            buffer = (char *)0x0;
          }
          else {
            memcpy((void *)((long)&pIVar3[4].next + (ulong)*(uint *)((long)&pIVar4[2].prev + 4)),
                   buffer,(long)iVar8);
            buffer = buffer + iVar8;
          }
          *(int *)((long)&pIVar3[2].prev + 4) = *(int *)((long)&pIVar4[2].prev + 4) + iVar8;
          *(undefined4 *)&pIVar3[1].prev = 0;
          pIVar3 = pIVar4->next;
          pIVar1 = pIVar4->prev;
          pIVar3->prev = pIVar1;
          pIVar1->next = pIVar3;
          pIVar4->next = pIVar4;
          pIVar4->prev = pIVar4;
          if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
            free(pIVar4);
          }
          else {
            (*ikcp_free_hook)(pIVar4);
          }
          len = len - iVar8;
        }
      }
      if (len < 1) {
        return 0;
      }
      uVar9 = kcp->mss;
    }
    uVar6 = 1;
    if (((int)uVar9 < len) && (uVar6 = ((len + uVar9) - 1) / uVar9, 0x7f < (int)uVar6)) {
      return -2;
    }
    iVar8 = uVar6 + (uVar6 == 0);
    if (iVar8 < 1) {
      return 0;
    }
    p_Var10 = ikcp_malloc_hook;
    while( true ) {
      iVar8 = iVar8 + -1;
      IVar2 = kcp->mss;
      if (len < (int)kcp->mss) {
        IVar2 = len;
      }
      sVar7 = (size_t)(int)IVar2;
      if (p_Var10 == (_func_void_ptr_size_t *)0x0) {
        pIVar4 = (IQUEUEHEAD *)malloc(sVar7 + 0x48);
        p_Var10 = (_func_void_ptr_size_t *)0x0;
      }
      else {
        pIVar4 = (IQUEUEHEAD *)(*p_Var10)(sVar7 + 0x48);
        p_Var10 = ikcp_malloc_hook;
      }
      if (pIVar4 == (IQUEUEHEAD *)0x0) break;
      if ((buffer != (char *)0x0) && (0 < len)) {
        memcpy(pIVar4 + 4,buffer,sVar7);
      }
      *(IUINT32 *)((long)&pIVar4[2].prev + 4) = IVar2;
      iVar5 = 0;
      if (kcp->stream == 0) {
        iVar5 = iVar8;
      }
      *(int *)&pIVar4[1].prev = iVar5;
      pIVar3 = (kcp->snd_queue).prev;
      pIVar4->prev = pIVar3;
      pIVar4->next = &kcp->snd_queue;
      pIVar3->next = pIVar4;
      kcp->nsnd_que = kcp->nsnd_que + 1;
      (kcp->snd_queue).prev = pIVar4;
      if (buffer != (char *)0x0) {
        buffer = buffer + sVar7;
      }
      len = len - IVar2;
      if (iVar8 == 0) {
        return 0;
      }
    }
    __assert_fail("seg",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                  ,0x206,"int ikcp_send(ikcpcb *, const char *, int)");
  }
  return -1;
}

Assistant:

int ikcp_send(ikcpcb *kcp, const char *buffer, int len)
{
	IKCPSEG *seg;
	int count, i;

	assert(kcp->mss > 0);
	if (len < 0) return -1;

	// append to previous segment in streaming mode (if possible)
	if (kcp->stream != 0) {
		if (!iqueue_is_empty(&kcp->snd_queue)) {
			IKCPSEG *old = iqueue_entry(kcp->snd_queue.prev, IKCPSEG, node);
			if (old->len < kcp->mss) {
				int capacity = kcp->mss - old->len;
				int extend = (len < capacity)? len : capacity;
				seg = ikcp_segment_new(kcp, old->len + extend);
				assert(seg);
				if (seg == NULL) {
					return -2;
				}
				iqueue_add_tail(&seg->node, &kcp->snd_queue);
				memcpy(seg->data, old->data, old->len);
				if (buffer) {
					memcpy(seg->data + old->len, buffer, extend);
					buffer += extend;
				}
				seg->len = old->len + extend;
				seg->frg = 0;
				len -= extend;
				iqueue_del_init(&old->node);
				ikcp_segment_delete(kcp, old);
			}
		}
		if (len <= 0) {
			return 0;
		}
	}

	if (len <= (int)kcp->mss) count = 1;
	else count = (len + kcp->mss - 1) / kcp->mss;

	if (count >= (int)IKCP_WND_RCV) return -2;

	if (count == 0) count = 1;

	// fragment
	for (i = 0; i < count; i++) {
		int size = len > (int)kcp->mss ? (int)kcp->mss : len;
		seg = ikcp_segment_new(kcp, size);
		assert(seg);
		if (seg == NULL) {
			return -2;
		}
		if (buffer && len > 0) {
			memcpy(seg->data, buffer, size);
		}
		seg->len = size;
		seg->frg = (kcp->stream == 0)? (count - i - 1) : 0;
		iqueue_init(&seg->node);
		iqueue_add_tail(&seg->node, &kcp->snd_queue);
		kcp->nsnd_que++;
		if (buffer) {
			buffer += size;
		}
		len -= size;
	}

	return 0;
}